

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

ssize_t tnt_io_sendv(tnt_stream_net *s,iovec *iov,int count)

{
  char *buf;
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ssize_t sVar6;
  
  buf = (s->sbuf).buf;
  if (buf == (char *)0x0) {
    sVar6 = tnt_io_sendv_raw(s,iov,count,1);
    return sVar6;
  }
  if (count < 1) {
    uVar5 = (s->sbuf).off;
    if ((s->sbuf).size < uVar5) {
      sVar6 = tnt_io_send_raw(s,buf,uVar5,1);
      if (sVar6 == -1) goto LAB_00111811;
      (s->sbuf).off = 0;
    }
    sVar6 = 0;
  }
  else {
    lVar4 = (ulong)(uint)count << 4;
    lVar2 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(long *)((long)&iov->iov_len + lVar2);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != lVar2);
    uVar1 = (s->sbuf).size;
    if (uVar1 < uVar5) {
      s->error = TNT_EBIG;
    }
    else {
      sVar3 = (s->sbuf).off;
      if (sVar3 + uVar5 <= uVar1) {
        if (count < 1) {
          return uVar5;
        }
        lVar2 = 0;
        do {
          memcpy((s->sbuf).buf + sVar3,*(void **)((long)&iov->iov_base + lVar2),
                 *(size_t *)((long)&iov->iov_len + lVar2));
          sVar3 = (s->sbuf).off + *(long *)((long)&iov->iov_len + lVar2);
          (s->sbuf).off = sVar3;
          lVar2 = lVar2 + 0x10;
        } while (lVar4 != lVar2);
        return uVar5;
      }
      sVar6 = tnt_io_send_raw(s,buf,sVar3,1);
      if (sVar6 != -1) {
        (s->sbuf).off = 0;
        if (count < 1) {
          return uVar5;
        }
        lVar2 = 0;
        sVar3 = 0;
        do {
          memcpy((s->sbuf).buf + sVar3,*(void **)((long)&iov->iov_base + lVar2),
                 *(size_t *)((long)&iov->iov_len + lVar2));
          sVar3 = (s->sbuf).off + *(long *)((long)&iov->iov_len + lVar2);
          (s->sbuf).off = sVar3;
          lVar2 = lVar2 + 0x10;
        } while ((ulong)(uint)count << 4 != lVar2);
        return uVar5;
      }
    }
LAB_00111811:
    sVar6 = -1;
  }
  return sVar6;
}

Assistant:

ssize_t
tnt_io_sendv(struct tnt_stream_net *s, struct iovec *iov, int count)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_sendv_raw(s, iov, count, 1);
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		tnt_io_sendv_put(s, iov, count);
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = 0;
	tnt_io_sendv_put(s, iov, count);
	return size;
}